

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.cpp
# Opt level: O2

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::NamedTest::result(NamedTest *this)

{
  _Alloc_hider _Var1;
  pointer *__ptr;
  long in_RSI;
  long *local_28;
  _Alloc_hider local_20;
  
  (**(code **)(**(long **)(in_RSI + 0x28) + 0x10))(&local_28);
  std::
  make_unique<oout::NamedResult,std::__cxx11::string_const&,std::unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20,
             (unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)
             (in_RSI + 8));
  _Var1._M_p = local_20._M_p;
  local_20._M_p = (pointer)0x0;
  (this->super_Test)._vptr_Test = (_func_int **)_Var1._M_p;
  std::unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_>::~unique_ptr
            ((unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_> *)&local_20);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> NamedTest::result() const
{
	return make_unique<NamedResult>(name, test->result());
}